

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Scope * scope_D_Scope(D_Scope *current,D_Scope *scope)

{
  D_Scope *pDVar1;
  D_Scope *pDVar2;
  
  pDVar2 = (D_Scope *)malloc(0x50);
  pDVar1 = current->up;
  pDVar2->hash = (D_SymHash *)0x0;
  pDVar2->updates = (D_Sym *)0x0;
  pDVar2->search = (D_Scope *)0x0;
  pDVar2->dynamic = (D_Scope *)0x0;
  pDVar2->up = (D_Scope *)0x0;
  pDVar2->up_updates = (D_Scope *)0x0;
  pDVar2->down = (D_Scope *)0x0;
  pDVar2->down_next = (D_Scope *)0x0;
  *(undefined8 *)pDVar2 = 0;
  pDVar2->ll = (D_Sym *)0x0;
  pDVar2->depth = current->depth;
  pDVar2->up = pDVar1;
  *(byte *)pDVar2 = *(byte *)pDVar2 & 0xfc | *(byte *)current & 3;
  pDVar2->search = current;
  pDVar2->dynamic = scope;
  pDVar2->up_updates = current;
  pDVar2->down_next = current->down;
  current->down = pDVar2;
  return pDVar2;
}

Assistant:

D_Scope *scope_D_Scope(D_Scope *current, D_Scope *scope) {
  D_Scope *st = MALLOC(sizeof(D_Scope)), *parent = current->up;
  memset(st, 0, sizeof(D_Scope));
  st->depth = current->depth;
  st->up = parent;
  st->kind = current->kind;
  st->search = current;
  st->dynamic = scope;
  st->up_updates = current;
  st->down_next = current->down;
  current->down = st;
  return st;
}